

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

void Cec_ManSimCompareConstScore(uint *p,int nWords,int *pScores)

{
  ulong uVar1;
  long lVar2;
  
  if ((*p & 1) == 0) {
    if (0 < nWords) {
      uVar1 = 0;
      do {
        if (p[uVar1] != 0) {
          lVar2 = 0;
          do {
            if ((p[uVar1] >> ((uint)lVar2 & 0x1f) & 1) != 0) {
              pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] =
                   pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] + 1;
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0x20);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 != (uint)nWords);
    }
  }
  else if (0 < nWords) {
    uVar1 = 0;
    do {
      if (p[uVar1] != 0xffffffff) {
        lVar2 = 0;
        do {
          if ((p[uVar1] >> ((uint)lVar2 & 0x1f) & 1) == 0) {
            pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] =
                 pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] + 1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x20);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)nWords);
  }
  return;
}

Assistant:

void Cec_ManSimCompareConstScore( unsigned * p, int nWords, int * pScores )
{
    int w, b;
    if ( p[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != ~0 )
                for ( b = 0; b < 32; b++ )
                    if ( ((~p[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != 0 )
                for ( b = 0; b < 32; b++ )
                    if ( ((p[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
}